

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_draw_index * nk_draw_list_alloc_elements(nk_draw_list *list,nk_size count)

{
  nk_size nVar1;
  void *pvVar2;
  nk_draw_index *pnVar3;
  int *piVar4;
  
  pnVar3 = (nk_draw_index *)nk_buffer_alloc(list->elements,NK_BUFFER_FRONT,count * 2,2);
  if (pnVar3 != (nk_draw_index *)0x0) {
    nVar1 = (list->buffer->memory).size;
    pvVar2 = (list->buffer->memory).ptr;
    list->element_count = list->element_count + (int)count;
    piVar4 = (int *)((long)pvVar2 +
                    (ulong)(list->cmd_count - 1) * -0x20 + (nVar1 - list->cmd_offset));
    *piVar4 = *piVar4 + (int)count;
  }
  return pnVar3;
}

Assistant:

NK_INTERN nk_draw_index*
nk_draw_list_alloc_elements(struct nk_draw_list *list, nk_size count)
{
nk_draw_index *ids;
struct nk_draw_command *cmd;
NK_STORAGE const nk_size elem_align = NK_ALIGNOF(nk_draw_index);
NK_STORAGE const nk_size elem_size = sizeof(nk_draw_index);
NK_ASSERT(list);
if (!list) return 0;

ids = (nk_draw_index*)
nk_buffer_alloc(list->elements, NK_BUFFER_FRONT, elem_size*count, elem_align);
if (!ids) return 0;
cmd = nk_draw_list_command_last(list);
list->element_count += (unsigned int)count;
cmd->elem_count += (unsigned int)count;
return ids;
}